

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr
          (SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *this,GLES2Context *ptr)

{
  GLES2Context *pGVar1;
  SharedPtrState<deqp::egl::GLES2ThreadTest::GLES2Context,_de::DefaultDeleter<deqp::egl::GLES2ThreadTest::GLES2Context>_>
  *pSVar2;
  DefaultDeleter<deqp::egl::GLES2ThreadTest::GLES2Context> local_25 [13];
  GLES2Context *local_18;
  GLES2Context *ptr_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *this_local;
  
  this->m_ptr = (GLES2Context *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (GLES2Context *)this;
  pSVar2 = (SharedPtrState<deqp::egl::GLES2ThreadTest::GLES2Context,_de::DefaultDeleter<deqp::egl::GLES2ThreadTest::GLES2Context>_>
            *)operator_new(0x20);
  pGVar1 = local_18;
  DefaultDeleter<deqp::egl::GLES2ThreadTest::GLES2Context>::DefaultDeleter(local_25);
  SharedPtrState<deqp::egl::GLES2ThreadTest::GLES2Context,_de::DefaultDeleter<deqp::egl::GLES2ThreadTest::GLES2Context>_>
  ::SharedPtrState(pSVar2,pGVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}